

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlineedit.cpp
# Opt level: O0

void __thiscall QLineEdit::keyReleaseEvent(QLineEdit *this,QKeyEvent *e)

{
  bool bVar1;
  QLineEditPrivate *this_00;
  QWidgetPrivate *in_RSI;
  QWidget *in_RDI;
  QLineEditPrivate *d;
  QKeyEvent *in_stack_ffffffffffffffd8;
  
  this_00 = d_func((QLineEdit *)0x5c68d1);
  bVar1 = isReadOnly((QLineEdit *)in_RDI);
  if (!bVar1) {
    QWidgetPrivate::handleSoftwareInputPanel(in_RSI,SUB81((ulong)this_00 >> 0x38,0));
  }
  QWidgetLineControl::updateCursorBlinking((QWidgetLineControl *)this_00);
  QWidget::keyReleaseEvent(in_RDI,in_stack_ffffffffffffffd8);
  return;
}

Assistant:

void QLineEdit::keyReleaseEvent(QKeyEvent *e)
{
    Q_D(QLineEdit);
    if (!isReadOnly())
        d->handleSoftwareInputPanel();
    d->control->updateCursorBlinking();
    QWidget::keyReleaseEvent(e);
}